

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

bool __thiscall
ON_Hatch::GetTightBoundingBox
          (ON_Hatch *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  int initial_capacity;
  bool bVar1;
  int index;
  ON_CurveArray curves;
  ON_Curve *local_50;
  ON_SimpleArray<ON_Curve_*> local_48;
  
  initial_capacity = (this->m_loops).m_count;
  ON_CurveArray::ON_CurveArray((ON_CurveArray *)&local_48,initial_capacity);
  if (0 < initial_capacity) {
    index = 0;
    do {
      local_50 = LoopCurve3d(this,index);
      ON_SimpleArray<ON_Curve_*>::Append(&local_48,&local_50);
      index = index + 1;
    } while (initial_capacity != index);
  }
  bVar1 = ON_CurveArray::GetTightBoundingBox((ON_CurveArray *)&local_48,tight_bbox,bGrowBox,xform);
  ON_CurveArray::~ON_CurveArray((ON_CurveArray *)&local_48);
  return bVar1;
}

Assistant:

bool ON_Hatch::GetTightBoundingBox( ON_BoundingBox& tight_bbox, bool bGrowBox, const ON_Xform* xform) const
{
  int i;
  int count = m_loops.Count();
  ON_CurveArray curves(count);
  for( i = 0; i < count; i++)
  {
    curves.Append( LoopCurve3d(i) );
  }
  return curves.GetTightBoundingBox(tight_bbox,bGrowBox,xform);
}